

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializers.hpp
# Opt level: O0

XMLNodeAdapter * BSDFData::operator>>(XMLNodeAdapter *node,AngleBasis *angleBasis)

{
  AngleBasis *node_00;
  allocator<char> local_c1;
  string local_c0;
  Child<std::vector<BSDFData::AngleBasisBlock,_std::allocator<BSDFData::AngleBasisBlock>_>_>
  local_a0;
  allocator<char> local_61;
  string local_60;
  Child<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_40;
  AngleBasis *local_18;
  AngleBasis *angleBasis_local;
  XMLNodeAdapter *node_local;
  
  local_18 = angleBasis;
  angleBasis_local = (AngleBasis *)node;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"AngleBasisName",&local_61)
  ;
  FileParse::
  Child<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::Child(&local_40,&local_60,&local_18->name,0);
  FileParse::operator>>(node,&local_40);
  FileParse::
  Child<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~Child(&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  node_00 = angleBasis_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"AngleBasisBlock",&local_c1);
  FileParse::
  Child<std::vector<BSDFData::AngleBasisBlock,_std::allocator<BSDFData::AngleBasisBlock>_>_>::Child
            (&local_a0,&local_c0,&local_18->blocks,0);
  FileParse::operator>>((XMLNodeAdapter *)node_00,&local_a0);
  FileParse::
  Child<std::vector<BSDFData::AngleBasisBlock,_std::allocator<BSDFData::AngleBasisBlock>_>_>::~Child
            (&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator(&local_c1);
  return (XMLNodeAdapter *)angleBasis_local;
}

Assistant:

const NodeAdapter & operator>>(const NodeAdapter & node, BSDFData::AngleBasis & angleBasis)
    {
        node >> FileParse::Child{"AngleBasisName", angleBasis.name};
        node >> FileParse::Child{"AngleBasisBlock", angleBasis.blocks};

        return node;
    }